

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O1

bool __thiscall flatbuffers::GoGRPCGenerator::generate(GoGRPCGenerator *this)

{
  ServiceDef *ns;
  ServiceDef *pSVar1;
  Namespace *this_00;
  SymbolTable<flatbuffers::ServiceDef> *pSVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  Parameters *parameters;
  long lVar9;
  string filename;
  string output;
  FlatBufFile file;
  Parameters p;
  bool local_141;
  string local_140;
  File *local_120;
  string local_118;
  GoGRPCGenerator *local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  undefined **local_b0;
  Parser *local_a8;
  string *local_a0;
  undefined4 local_98;
  CommentHolder local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_a8 = this->parser_;
  local_a0 = this->file_name_;
  local_b0 = &PTR__CommentHolder_003f42b8;
  local_98 = 0;
  local_90._vptr_CommentHolder = (_func_int **)&local_80;
  local_88 = 0;
  local_80 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  parameters = (Parameters *)0x13;
  local_f8 = this;
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x37afb8);
  iVar4 = (int)((ulong)((long)(local_a8->services_).vec.
                              super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_a8->services_).vec.
                             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_141 = iVar4 < 1;
  if (0 < iVar4) {
    lVar9 = 0;
    do {
      pSVar2 = &local_a8->services_;
      local_120 = (File *)operator_new(0x10);
      ns = (pSVar2->vec).
           super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9];
      (local_120->super_CommentHolder)._vptr_CommentHolder =
           (_func_int **)&PTR__CommentHolder_003f4140;
      local_120[1].super_CommentHolder._vptr_CommentHolder = (_func_int **)ns;
      pSVar1 = (local_f8->parser_->services_).vec.
               super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      BaseGenerator::LastNamespacePart_abi_cxx11_
                (&local_118,(BaseGenerator *)(pSVar1->super_Definition).defined_namespace,
                 (Namespace *)ns);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pSVar1->super_Definition).defined_namespace;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
      Namespace::GetFullyQualifiedName(&local_118,this_00,&local_140,1000);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      grpc_go_generator::GenerateServiceSource_abi_cxx11_
                (&local_118,(grpc_go_generator *)&local_b0,local_120,(Service *)&local_90,parameters
                );
      BaseGenerator::NamespaceDir_abi_cxx11_
                (&local_d0,&local_f8->super_BaseGenerator,
                 (pSVar1->super_Definition).defined_namespace,false);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d0,
                                  *(ulong *)&(pSVar1->super_Definition).name._M_dataplus);
      local_f0 = &local_e0;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar5[3];
      }
      else {
        local_e0 = *plVar7;
        local_f0 = (long *)*plVar5;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_140.field_2._M_allocated_capacity = *psVar8;
        local_140.field_2._8_8_ = plVar5[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar8;
        local_140._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_140._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = SaveFile(local_140._M_dataplus._M_p,local_118._M_dataplus._M_p,
                       local_118._M_string_length,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      (*(local_120->super_CommentHolder)._vptr_CommentHolder[1])();
      if (!bVar3) break;
      lVar9 = lVar9 + 1;
      lVar6 = (long)(int)((ulong)((long)(local_a8->services_).vec.
                                        super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_a8->services_).vec.
                                       super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_141 = lVar6 <= lVar9;
    } while (lVar9 < lVar6);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_90._vptr_CommentHolder != (_func_int **)&local_80) {
    operator_delete(local_90._vptr_CommentHolder,CONCAT71(uStack_7f,local_80) + 1);
  }
  return local_141;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageGo);
    grpc_go_generator::Parameters p;
    p.custom_method_io_type = "flatbuffers.Builder";
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name = LastNamespacePart(*(def->defined_namespace));
      p.service_prefix =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_go_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "_grpc.go";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }